

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O1

bool __thiscall
Memory::HeapBlockMap32::RescanPage
          (HeapBlockMap32 *this,void *dirtyPage,bool *anyObjectsMarkedOnPage,Recycler *recycler)

{
  HeapBlockType blockType;
  L2MapChunk *chunk;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  undefined4 *puVar5;
  uint id2;
  ulong uVar6;
  
  chunk = this->map[(ulong)dirtyPage >> 0x14 & 0xfff];
  if (chunk != (L2MapChunk *)0x0) {
    uVar6 = (ulong)dirtyPage >> 0xc & 0xff;
    blockType = chunk->blockInfo[uVar6].blockType;
    bVar2 = true;
    id2 = (uint)uVar6;
    switch(blockType) {
    case LargeBlockTypeCount:
    case SmallNormalBlockWithBarrierType:
      bVar3 = RescanHeapBlock<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
                        (this,dirtyPage,blockType,chunk,id2,anyObjectsMarkedOnPage,recycler);
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                         ,0x2b7,"(false)","false");
      recycler = (Recycler *)(ulong)bVar4;
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    case FreeBlockType:
      bVar3 = (byte)recycler;
      goto LAB_006be96f;
    case SmallFinalizableBlockType:
    case MediumAllocBlockTypeCount:
      bVar3 = RescanHeapBlock<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
                        (this,dirtyPage,blockType,chunk,id2,anyObjectsMarkedOnPage,recycler);
      break;
    case MediumNormalBlockType:
    case MediumNormalBlockWithBarrierType:
      bVar3 = RescanHeapBlock<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>
                        (this,dirtyPage,blockType,chunk,id2,anyObjectsMarkedOnPage,recycler);
      break;
    case MediumFinalizableBlockType:
    case MediumFinalizableBlockWithBarrierType:
      bVar3 = RescanHeapBlock<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
                        (this,dirtyPage,blockType,chunk,id2,anyObjectsMarkedOnPage,recycler);
    }
    bVar2 = false;
LAB_006be96f:
    if (!bVar2) goto LAB_006be976;
  }
  bVar3 = 0;
LAB_006be976:
  return (bool)(bVar3 & 1);
}

Assistant:

bool
HeapBlockMap32::RescanPage(void * dirtyPage, bool* anyObjectsMarkedOnPage, Recycler * recycler)
{
    uint id1 = GetLevel1Id(dirtyPage);
    L2MapChunk * chunk = map[id1];
    if (chunk != nullptr)
    {
        uint id2 = GetLevel2Id(dirtyPage);
        HeapBlock::HeapBlockType blockType = chunk->blockInfo[id2].blockType;
        // Determine block type and process as appropriate
        switch (blockType)
        {
        case HeapBlock::HeapBlockType::FreeBlockType:
            // We had a false reference to a free block.  Do nothing.
            break;

        case HeapBlock::HeapBlockType::SmallNormalBlockType:
#ifdef RECYCLER_WRITE_BARRIER
        case HeapBlock::HeapBlockType::SmallNormalBlockWithBarrierType:
#endif
            return RescanHeapBlock<SmallNormalHeapBlock>(dirtyPage, blockType, chunk, id2, anyObjectsMarkedOnPage, recycler);
        case HeapBlock::HeapBlockType::SmallFinalizableBlockType:
#ifdef RECYCLER_WRITE_BARRIER
        case HeapBlock::HeapBlockType::SmallFinalizableBlockWithBarrierType:
#endif
            return RescanHeapBlock<SmallFinalizableHeapBlock>(dirtyPage, blockType, chunk, id2, anyObjectsMarkedOnPage, recycler);
#ifdef RECYCLER_VISITED_HOST
        case HeapBlock::HeapBlockType::SmallRecyclerVisitedHostBlockType:
            return RescanHeapBlock<SmallRecyclerVisitedHostHeapBlock>(dirtyPage, blockType, chunk, id2, anyObjectsMarkedOnPage, recycler);
#endif
        case HeapBlock::HeapBlockType::MediumNormalBlockType:
#ifdef RECYCLER_WRITE_BARRIER
        case HeapBlock::HeapBlockType::MediumNormalBlockWithBarrierType:
#endif
            return RescanHeapBlock<MediumNormalHeapBlock>(dirtyPage, blockType, chunk, id2, anyObjectsMarkedOnPage, recycler);
        case HeapBlock::HeapBlockType::MediumFinalizableBlockType:
#ifdef RECYCLER_WRITE_BARRIER
        case HeapBlock::HeapBlockType::MediumFinalizableBlockWithBarrierType:
#endif
            return RescanHeapBlock<MediumFinalizableHeapBlock>(dirtyPage, blockType, chunk, id2, anyObjectsMarkedOnPage, recycler);
#ifdef RECYCLER_VISITED_HOST
        case HeapBlock::HeapBlockType::MediumRecyclerVisitedHostBlockType:
            return RescanHeapBlock<MediumRecyclerVisitedHostHeapBlock>(dirtyPage, blockType, chunk, id2, anyObjectsMarkedOnPage, recycler);
#endif
        default:
            // Shouldn't be here -- leaf blocks aren't rescanned, and large blocks are handled separately
            Assert(false);
            break;
        }
    }

    return false;
}